

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O2

uint Memory::ValidPointers<SmallAllocationBlockAttributes>::CalculateBucketInfo
               (uint bucketIndex,uint *indexPerObject)

{
  uint uVar1;
  
  uVar1 = bucketIndex * 0x10 + 0x10;
  *indexPerObject = uVar1 >> 4;
  return 0x1000U - (int)(0x1000 % (ulong)uVar1) >> 4;
}

Assistant:

uint ValidPointers<TBlockAttributes>::CalculateBucketInfo(uint bucketIndex, uint * indexPerObject)
{
    uint bucketSize;
    if (TBlockAttributes::IsSmallBlock)
    {
        bucketSize = TBlockAttributes::MinObjectSize + HeapConstants::ObjectGranularity * bucketIndex;
    }
    else
    {
        bucketSize = TBlockAttributes::MinObjectSize + HeapConstants::MediumObjectGranularity * (bucketIndex + 1);
    }
    *indexPerObject = bucketSize / HeapConstants::ObjectGranularity;
    return ((TBlockAttributes::PageCount * AutoSystemInfo::PageSize) / bucketSize) * bucketSize / HeapConstants::ObjectGranularity;
}